

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O1

int start_game(void)

{
  int iVar1;
  __pid_t _Var2;
  int iVar3;
  PIPE *pipes_00;
  ssize_t sVar4;
  char *__s;
  long lVar5;
  int game_pipe [2];
  char msg [4096];
  PIPE pipes [20];
  int local_2290;
  int local_228c;
  char local_2288 [4096];
  int local_1288 [2];
  undefined2 local_1280 [10];
  undefined8 local_126c [5];
  undefined8 auStack_123e [580];
  
  puts("Start game server...");
  lVar5 = 0;
  do {
    pipe((int *)((long)local_1288 + lVar5));
    *(undefined2 *)((long)local_1280 + lVar5) = 0;
    *(undefined8 *)((long)local_126c + lVar5) = 0;
    *(undefined8 *)((long)local_126c + lVar5 + 8) = 0;
    *(undefined8 *)((long)local_126c + lVar5 + 0x10) = 0;
    *(undefined8 *)((long)local_126c + lVar5 + 0x18) = 0;
    *(undefined8 *)((long)local_126c + lVar5 + 0x20) = 0;
    *(undefined8 *)(&stack0xffffffffffffedbc + lVar5) = 0;
    *(undefined8 *)((long)auStack_123e + lVar5) = 0;
    lVar5 = lVar5 + 0xec;
  } while (lVar5 != 0x1270);
  iVar1 = shmget(0,0x1270,0x7a0);
  if (iVar1 == -1) {
    __s = "Sharing memory cannot been created!";
  }
  else {
    pipes_00 = (PIPE *)shmat(iVar1,(void *)0x0,0);
    if (pipes_00 == (PIPE *)0xffffffffffffffff) {
      __s = "Cannot link sharing memory to this process!(Game server)";
    }
    else {
      memcpy(pipes_00,local_1288,0x1270);
      if (pipes_00 == (PIPE *)0x0) {
        __s = "Cannot set sharing memory data!";
      }
      else {
        pipe(&local_2290);
        _Var2 = fork();
        if ((_Var2 != 0) || (iVar1 = start_websocket(0x2382,iVar1,local_228c), iVar1 != -1)) {
          do {
            iVar1 = 0;
            memset(local_2288,0,0x1000);
            sVar4 = read(local_2290,local_2288,0x1000);
            if (sVar4 < 1) {
              puts("Pipe between webSocket and Game server is broken!");
              iVar1 = 1;
            }
            else {
              iVar3 = deal_info(local_2288,pipes_00);
              if (iVar3 == -1) {
                printf("The info:%s is illegal!\n");
                iVar1 = 5;
              }
            }
          } while ((iVar1 == 0) || (iVar1 == 5));
          return -1;
        }
        __s = "Websocket server start failure!";
      }
    }
  }
  puts(__s);
  return -1;
}

Assistant:

int start_game(){
    printf("Start game server...\n");
    int game_infor[64];

    struct PIPE pipes[MAX_USER];
    for(int i = 0; i < MAX_USER; i++){
        //pipes[i]= (struct PIPE *)malloc(sizeof(struct PIPE));
        pipe(pipes[i].pipe);
        pipes[i].useState = false;
        pipes[i].level = 0;
        memset(pipes[i].score, 0 ,MAX_SONG);
        strcpy(pipes[i].name, "");
    }

    int shm_id;
    struct PIPE *shared = NULL;
    if((shm_id = shmget(IPC_PRIVATE, sizeof(struct PIPE) * MAX_USER, 0640 | IPC_CREAT | IPC_EXCL)) == -1){
        printf("Sharing memory cannot been created!\n");
        return -1;
    }
    shared = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(shared == (struct PIPE *)-1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }
    if(memcpy(shared, pipes,sizeof(struct PIPE) * MAX_USER) == NULL){
        printf("Cannot set sharing memory data!\n");
        return -1;
    }

    int game_pipe[2];
    pipe(game_pipe);

    int websocket_fd = 0;

//    if(init_info(game_infor) == -1){
//        printf("Game infor inti failure!\n");
//        return -1;
//    }
    if((websocket_fd = fork()) == 0){
        if(start_websocket(WEBSOCKET_PORT, shm_id, game_pipe[1]) == -1){
            printf("Websocket server start failure!\n");
            return -1;
        }
    }

    while(true){
        char msg[MSG_MAX_SIZE];
        memset(msg, 0, MSG_MAX_SIZE);
        if(read(game_pipe[0], msg, MSG_MAX_SIZE) <= 0){
            printf("Pipe between webSocket and Game server is broken!\n");
            return -1;
        }
        if(deal_info(msg, shared) == -1){
            printf("The info:%s is illegal!\n", msg);
            continue;
        }
    }
}